

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O2

void Abc_NtkRetimeNode(Abc_Obj_t *pObj,int fForward,int fInitial)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pFaninNew;
  long lVar3;
  Abc_Ntk_t *local_38;
  
  vNodes = Vec_PtrAlloc(10);
  if (fForward == 0) {
    iVar1 = 0;
    if (fInitial == 0) {
      local_38 = (Abc_Ntk_t *)0x0;
    }
    else {
      local_38 = (Abc_Ntk_t *)
                 **(undefined8 **)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray] + 0x40)
      ;
      Abc_NtkDupObj(local_38,pObj,0);
      for (lVar3 = 0; lVar3 < (pObj->vFanouts).nSize; lVar3 = lVar3 + 1) {
        pAVar2 = *(Abc_Obj_t **)
                  ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]] + 0x40);
        if ((pAVar2->vFanins).nSize != 0) {
          __assert_fail("Abc_ObjFaninNum(pNext->pCopy) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retIncrem.c"
                        ,0x163,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
        }
        Abc_ObjAddFanin(pAVar2,(pObj->field_6).pCopy);
      }
    }
    Abc_NodeCollectFanouts(pObj,vNodes);
    for (; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar1);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retIncrem.c"
                      ,0x16c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
      }
      Abc_ObjTransferFanout(pAVar2,pObj);
      Abc_NtkDeleteObj(pAVar2);
    }
    for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
      pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]];
      pFaninNew = Abc_NtkCreateLatch(pObj->pNtk);
      Abc_ObjPatchFanin(pObj,pAVar2,pFaninNew);
      Abc_ObjAddFanin(pFaninNew,pAVar2);
      if (fInitial != 0) {
        pAVar2 = Abc_NtkCreateNodeBuf(local_38,(Abc_Obj_t *)0x0);
        (pFaninNew->field_6).pCopy = pAVar2;
        Abc_ObjAddFanin((pObj->field_6).pCopy,pAVar2);
      }
    }
  }
  else {
    if (fInitial != 0) {
      iVar1 = Abc_ObjSopSimulate(pObj);
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar1;
    }
    Abc_NodeCollectFanins(pObj,vNodes);
    for (iVar1 = 0; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar1);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retIncrem.c"
                      ,0x14c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
      }
      Abc_ObjPatchFanin(pObj,pAVar2,
                        (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
      if ((pAVar2->vFanouts).nSize == 0) {
        Abc_NtkDeleteObj(pAVar2);
      }
    }
    pAVar2 = Abc_NtkCreateLatch(pObj->pNtk);
    if (0 < (pObj->vFanouts).nSize) {
      Abc_ObjTransferFanout(pObj,pAVar2);
    }
    Abc_ObjAddFanin(pAVar2,pObj);
    if (fInitial != 0) {
      pAVar2->field_6 = pObj->field_6;
    }
  }
  Vec_PtrFree(vNodes);
  return;
}

Assistant:

void Abc_NtkRetimeNode( Abc_Obj_t * pObj, int fForward, int fInitial )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNext, * pLatch;
    int i;
    vNodes = Vec_PtrAlloc( 10 );
    if ( fForward ) 
    {
        // compute the initial value
        if ( fInitial )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // collect fanins
        Abc_NodeCollectFanins( pObj, vNodes );
        // make the node point to the fanins fanins
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjPatchFanin( pObj, pNext, Abc_ObjFanin0(pNext) );
            if ( Abc_ObjFanoutNum(pNext) == 0 )
                Abc_NtkDeleteObj(pNext);            
        }
        // add a new latch on top
        pNext = Abc_NtkCreateLatch(pObj->pNtk);
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Abc_ObjTransferFanout( pObj, pNext );
        Abc_ObjAddFanin( pNext, pObj );
        // set the initial value
        if ( fInitial )
            pNext->pCopy = pObj->pCopy;
    }
    else
    {
        // compute the initial value
        if ( fInitial )
        {
            pNtkNew = Abc_ObjFanout0(pObj)->pCopy->pNtk;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pNext, i )
            {
                assert( Abc_ObjFaninNum(pNext->pCopy) == 0 );
                Abc_ObjAddFanin( pNext->pCopy, pObj->pCopy );
            }
        }
        // collect fanouts
        Abc_NodeCollectFanouts( pObj, vNodes );
        // make the fanouts fanouts point to the node
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjTransferFanout( pNext, pObj );
            Abc_NtkDeleteObj( pNext );  
        }
        // add new latches to the fanins
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            pLatch = Abc_NtkCreateLatch(pObj->pNtk);
            Abc_ObjPatchFanin( pObj, pNext, pLatch );
            Abc_ObjAddFanin( pLatch, pNext );
            // create buffer isomorphic to this latch
            if ( fInitial )
            {
                pLatch->pCopy = Abc_NtkCreateNodeBuf( pNtkNew, NULL );
                Abc_ObjAddFanin( pObj->pCopy, pLatch->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
}